

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::Kernel::MergeFrom(Kernel *this,Kernel *from)

{
  void *pvVar1;
  LogMessage *other;
  PolyKernel *this_00;
  SigmoidKernel *this_01;
  LinearKernel *this_02;
  RBFKernel *this_03;
  PolyKernel *from_00;
  SigmoidKernel *from_01;
  LinearKernel *from_02;
  RBFKernel *from_03;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/SVM.pb.cc"
               ,0x510);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  switch(from->_oneof_case_[0]) {
  case 1:
    break;
  case 2:
    if (this->_oneof_case_[0] == 2) {
      this_03 = (this->kernel_).rbfkernel_;
    }
    else {
      clear_kernel(this);
      this->_oneof_case_[0] = 2;
      this_03 = (RBFKernel *)operator_new(0x20);
      RBFKernel::RBFKernel(this_03);
      (this->kernel_).rbfkernel_ = this_03;
      if (from->_oneof_case_[0] != 2) {
        protobuf_SVM_2eproto::InitDefaults();
        from_03 = (RBFKernel *)&_RBFKernel_default_instance_;
        goto LAB_0024b38e;
      }
    }
    from_03 = (from->kernel_).rbfkernel_;
LAB_0024b38e:
    RBFKernel::MergeFrom(this_03,from_03);
    return;
  case 3:
    if (this->_oneof_case_[0] == 3) {
      this_00 = (this->kernel_).polykernel_;
    }
    else {
      clear_kernel(this);
      this->_oneof_case_[0] = 3;
      this_00 = (PolyKernel *)operator_new(0x28);
      PolyKernel::PolyKernel(this_00);
      (this->kernel_).polykernel_ = this_00;
      if (from->_oneof_case_[0] != 3) {
        protobuf_SVM_2eproto::InitDefaults();
        from_00 = (PolyKernel *)&_PolyKernel_default_instance_;
        goto LAB_0024b34c;
      }
    }
    from_00 = (from->kernel_).polykernel_;
LAB_0024b34c:
    PolyKernel::MergeFrom(this_00,from_00);
    return;
  case 4:
    if (this->_oneof_case_[0] == 4) {
      this_01 = (this->kernel_).sigmoidkernel_;
LAB_0024b2cd:
      from_01 = (from->kernel_).sigmoidkernel_;
    }
    else {
      clear_kernel(this);
      this->_oneof_case_[0] = 4;
      this_01 = (SigmoidKernel *)operator_new(0x28);
      SigmoidKernel::SigmoidKernel(this_01);
      (this->kernel_).sigmoidkernel_ = this_01;
      if (from->_oneof_case_[0] == 4) goto LAB_0024b2cd;
      protobuf_SVM_2eproto::InitDefaults();
      from_01 = (SigmoidKernel *)&_SigmoidKernel_default_instance_;
    }
    SigmoidKernel::MergeFrom(this_01,from_01);
  default:
    goto switchD_0024b217_default;
  }
  if (this->_oneof_case_[0] == 1) {
    this_02 = (this->kernel_).linearkernel_;
LAB_0024b305:
    from_02 = (from->kernel_).linearkernel_;
  }
  else {
    clear_kernel(this);
    this->_oneof_case_[0] = 1;
    this_02 = (LinearKernel *)operator_new(0x18);
    LinearKernel::LinearKernel(this_02);
    (this->kernel_).linearkernel_ = this_02;
    if (from->_oneof_case_[0] == 1) goto LAB_0024b305;
    protobuf_SVM_2eproto::InitDefaults();
    from_02 = (LinearKernel *)&_LinearKernel_default_instance_;
  }
  LinearKernel::MergeFrom(this_02,from_02);
switchD_0024b217_default:
  return;
}

Assistant:

void Kernel::MergeFrom(const Kernel& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Kernel)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.kernel_case()) {
    case kLinearKernel: {
      mutable_linearkernel()->::CoreML::Specification::LinearKernel::MergeFrom(from.linearkernel());
      break;
    }
    case kRbfKernel: {
      mutable_rbfkernel()->::CoreML::Specification::RBFKernel::MergeFrom(from.rbfkernel());
      break;
    }
    case kPolyKernel: {
      mutable_polykernel()->::CoreML::Specification::PolyKernel::MergeFrom(from.polykernel());
      break;
    }
    case kSigmoidKernel: {
      mutable_sigmoidkernel()->::CoreML::Specification::SigmoidKernel::MergeFrom(from.sigmoidkernel());
      break;
    }
    case KERNEL_NOT_SET: {
      break;
    }
  }
}